

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

int __thiscall Fl_Preferences::Node::remove(Node *this,char *__filename)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  int iVar4;
  undefined8 unaff_RBP;
  Node *pNVar5;
  
  pNVar2 = (this->field_2).parent_;
  if (pNVar2 == (Node *)0x0 || (this->field_0x30 & 2) != 0) {
    iVar4 = 0;
  }
  else {
    pNVar1 = pNVar2->child_;
    if (pNVar1 == (Node *)0x0) {
LAB_001c4ca2:
      iVar4 = 0;
    }
    else {
      if (pNVar1 == this) {
        pNVar3 = (Node *)0x0;
      }
      else {
        do {
          pNVar3 = pNVar1;
          pNVar1 = pNVar3->next_;
          if (pNVar1 == (Node *)0x0) goto LAB_001c4ca2;
        } while (pNVar1 != this);
      }
      pNVar5 = (Node *)&pNVar3->next_;
      if (pNVar3 == (Node *)0x0) {
        pNVar5 = pNVar2;
      }
      pNVar5->child_ = pNVar1->next_;
      iVar4 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    }
    pNVar1 = (Node *)0x0;
    pNVar2 = (Node *)0x0;
    if ((this->field_0x30 & 2) == 0) {
      pNVar2 = (this->field_2).parent_;
    }
    pNVar2->field_0x30 = pNVar2->field_0x30 | 1;
    if ((this->field_0x30 & 2) == 0) {
      pNVar1 = (this->field_2).parent_;
    }
    pNVar1->field_0x30 = pNVar1->field_0x30 & 0xfb;
  }
  ~Node(this);
  operator_delete(this,0x48);
  return iVar4;
}

Assistant:

char Fl_Preferences::Node::remove() {
  Node *nd = 0, *np;
  if ( parent() ) {
    nd = parent()->child_; np = 0L;
    for ( ; nd; np = nd, nd = nd->next_ ) {
      if ( nd == this ) {
	if ( np )
	  np->next_ = nd->next_;
	else
	  parent()->child_ = nd->next_;
	break;
      }
    }
    parent()->dirty_ = 1;
    parent()->updateIndex();
  }
  delete this;
  return ( nd != 0 );
}